

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_message.cc
# Opt level: O0

LogMessage * __thiscall
absl::log_internal::LogMessage::WithMetadataFrom(LogMessage *this,LogEntry *entry)

{
  bool bVar1;
  int iVar2;
  LogSeverity LVar3;
  tid_t tVar4;
  pointer pLVar5;
  LogEntry *entry_local;
  LogMessage *this_local;
  
  pLVar5 = std::
           unique_ptr<absl::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::log_internal::LogMessage::LogMessageData>_>
           ::operator->(&this->data_);
  (pLVar5->entry).full_filename_._M_len = (entry->full_filename_)._M_len;
  (pLVar5->entry).full_filename_._M_str = (entry->full_filename_)._M_str;
  pLVar5 = std::
           unique_ptr<absl::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::log_internal::LogMessage::LogMessageData>_>
           ::operator->(&this->data_);
  (pLVar5->entry).base_filename_._M_len = (entry->base_filename_)._M_len;
  (pLVar5->entry).base_filename_._M_str = (entry->base_filename_)._M_str;
  iVar2 = entry->line_;
  pLVar5 = std::
           unique_ptr<absl::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::log_internal::LogMessage::LogMessageData>_>
           ::operator->(&this->data_);
  (pLVar5->entry).line_ = iVar2;
  bVar1 = entry->prefix_;
  pLVar5 = std::
           unique_ptr<absl::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::log_internal::LogMessage::LogMessageData>_>
           ::operator->(&this->data_);
  (pLVar5->entry).prefix_ = (bool)(bVar1 & 1);
  LVar3 = entry->severity_;
  pLVar5 = std::
           unique_ptr<absl::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::log_internal::LogMessage::LogMessageData>_>
           ::operator->(&this->data_);
  (pLVar5->entry).severity_ = LVar3;
  iVar2 = entry->verbose_level_;
  pLVar5 = std::
           unique_ptr<absl::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::log_internal::LogMessage::LogMessageData>_>
           ::operator->(&this->data_);
  (pLVar5->entry).verbose_level_ = iVar2;
  pLVar5 = std::
           unique_ptr<absl::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::log_internal::LogMessage::LogMessageData>_>
           ::operator->(&this->data_);
  (pLVar5->entry).timestamp_.rep_.rep_hi_ = (entry->timestamp_).rep_.rep_hi_;
  (pLVar5->entry).timestamp_.rep_.rep_lo_ = (entry->timestamp_).rep_.rep_lo_;
  tVar4 = entry->tid_;
  pLVar5 = std::
           unique_ptr<absl::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::log_internal::LogMessage::LogMessageData>_>
           ::operator->(&this->data_);
  (pLVar5->entry).tid_ = tVar4;
  return this;
}

Assistant:

LogMessage& LogMessage::WithMetadataFrom(const absl::LogEntry& entry) {
  data_->entry.full_filename_ = entry.full_filename_;
  data_->entry.base_filename_ = entry.base_filename_;
  data_->entry.line_ = entry.line_;
  data_->entry.prefix_ = entry.prefix_;
  data_->entry.severity_ = entry.severity_;
  data_->entry.verbose_level_ = entry.verbose_level_;
  data_->entry.timestamp_ = entry.timestamp_;
  data_->entry.tid_ = entry.tid_;
  return *this;
}